

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::internal::format_decimal<unsigned_long,char,fmt::internal::NoThousandsSep>
               (long buffer,ulong value,uint num_digits)

{
  long lVar1;
  uint index;
  uint index_1;
  uint num_digits_local;
  unsigned_long value_local;
  char *buffer_local;
  
  _index_1 = value;
  value_local = buffer + (ulong)num_digits;
  while (99 < _index_1) {
    lVar1 = (_index_1 % 100) * 2;
    _index_1 = _index_1 / 100;
    *(undefined1 *)(value_local - 1) = BasicData<void>::DIGITS[(int)lVar1 + 1];
    NoThousandsSep::operator()
              ((NoThousandsSep *)((long)&buffer_local + 7),(char *)(value_local - 1));
    *(undefined1 *)(value_local - 2) = BasicData<void>::DIGITS[lVar1];
    NoThousandsSep::operator()
              ((NoThousandsSep *)((long)&buffer_local + 7),(char *)(value_local - 2));
    value_local = value_local - 2;
  }
  if (_index_1 < 10) {
    *(char *)(value_local - 1) = (char)_index_1 + '0';
  }
  else {
    *(undefined1 *)(value_local - 1) = BasicData<void>::DIGITS[(int)(_index_1 << 1) + 1];
    NoThousandsSep::operator()
              ((NoThousandsSep *)((long)&buffer_local + 7),(char *)(value_local - 1));
    *(undefined1 *)(value_local - 2) = BasicData<void>::DIGITS[_index_1 << 1 & 0xffffffff];
  }
  return;
}

Assistant:

inline void format_decimal(Char *buffer, UInt value, unsigned num_digits, ThousandsSep thousands_sep)
{
    buffer += num_digits;
    while (value >= 100)
    {
        // Integer division is slow so do it for a group of two digits instead
        // of for every digit. The idea comes from the talk by Alexandrescu
        // "Three Optimization Tips for C++". See speed-test for a comparison.
        unsigned index = static_cast<unsigned>((value % 100) * 2);
        value /= 100;
        *--buffer = Data::DIGITS[index + 1];
        thousands_sep(buffer);
        *--buffer = Data::DIGITS[index];
        thousands_sep(buffer);
    }
    if (value < 10)
    {
        *--buffer = static_cast<char>('0' + value);
        return;
    }
    unsigned index = static_cast<unsigned>(value * 2);
    *--buffer = Data::DIGITS[index + 1];
    thousands_sep(buffer);
    *--buffer = Data::DIGITS[index];
}